

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O1

void __thiscall
RecursionState::restore_state<WorkerMemory<ImputedData<unsigned_long,double>,double,double>>
          (RecursionState *this,
          WorkerMemory<ImputedData<unsigned_long,_double>,_double,_double> *workspace)

{
  pointer puVar1;
  pointer puVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar9;
  tuple<> local_41;
  undefined8 local_40;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_38;
  
  workspace->split_ix = this->split_ix;
  workspace->end = this->end;
  if ((workspace->col_sampler).tree_weights.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (workspace->col_sampler).tree_weights.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar7 = 0x1a8;
    lVar8 = 0x28;
  }
  else {
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              (&(workspace->col_sampler).tree_weights,&this->col_sampler_weights);
    lVar7 = 0x1d8;
    lVar8 = 0x30;
  }
  *(undefined8 *)((long)(workspace->rnd_generator).state + lVar7 + -0x30) =
       *(undefined8 *)((long)&this->st + lVar8);
  if (this->full_state == true) {
    workspace->st = this->st;
    sVar3 = this->st_NA;
    sVar4 = this->end_NA;
    workspace->st_NA = sVar3;
    workspace->end_NA = sVar4;
    workspace->changed_weights = this->changed_weights;
    if ((workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (workspace->comb_val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      puVar1 = (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (this->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((puVar1 != puVar2) &&
         (memmove((workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + sVar3,puVar1,(long)puVar2 - (long)puVar1),
         this->changed_weights == true)) {
        sVar3 = workspace->st_NA;
        sVar4 = workspace->end_NA;
        lVar7 = sVar4 - sVar3;
        pdVar5 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pdVar5 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          if (sVar4 != sVar3) {
            lVar8 = 0;
            do {
              local_40 = *(undefined8 *)
                          ((long)(this->weights_arr)._M_t.
                                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar8);
              local_38._M_head_impl =
                   (unsigned_long *)
                   ((long)(workspace->ix_arr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar8 + workspace->st_NA * 8);
              pVar9 = tsl::detail_robin_hash::
                      robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                      ::
                      insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                  *)&workspace->weights_map,local_38._M_head_impl,
                                 (piecewise_construct_t *)&std::piecewise_construct,
                                 (tuple<const_unsigned_long_&> *)&local_38,&local_41);
              *(undefined8 *)((pVar9.first.m_bucket.m_bucket)->m_value + 8) = local_40;
              lVar8 = lVar8 + 8;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
        }
        else if (sVar4 != sVar3) {
          pdVar6 = (this->weights_arr)._M_t.
                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                   super__Head_base<0UL,_double_*,_false>._M_head_impl;
          puVar1 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = 0;
          do {
            pdVar5[puVar1[sVar3 + lVar8]] = pdVar6[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar7 != lVar8);
        }
      }
    }
  }
  return;
}

Assistant:

void RecursionState::restore_state(WorkerMemory &workspace)
{
    workspace.split_ix         =  this->split_ix;
    workspace.end              =  this->end;
    if (!workspace.col_sampler.has_weights())
        workspace.col_sampler.curr_pos = this->sampler_pos;
    else  {
        workspace.col_sampler.tree_weights  =  std::move(this->col_sampler_weights);
        workspace.col_sampler.n_dropped     =  this->n_dropped;
    }

    if (this->full_state)
    {
        workspace.st         =  this->st;
        workspace.st_NA      =  this->st_NA;
        workspace.end_NA     =  this->end_NA;

        workspace.changed_weights = this->changed_weights;

        if (workspace.comb_val.empty() && !this->ix_arr.empty())
        {
            std::copy(this->ix_arr.begin(),
                      this->ix_arr.end(),
                      workspace.ix_arr.begin() + this->st_NA);
            if (this->changed_weights)
            {
                size_t tot = workspace.end_NA - workspace.st_NA;
                if (!workspace.weights_arr.empty())
                    for (size_t ix = 0; ix < tot; ix++)
                        workspace.weights_arr[workspace.ix_arr[ix + workspace.st_NA]] = this->weights_arr[ix];
                else
                    for (size_t ix = 0; ix < tot; ix++)
                        workspace.weights_map[workspace.ix_arr[ix + workspace.st_NA]] = this->weights_arr[ix];
            }
        }
    }
}